

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O1

void am_execute_script_step_one_proc(Am_Object *cmd)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *pAVar3;
  ostream *poVar4;
  Am_Slot_Key key;
  Am_Object script_window;
  Am_Object line;
  Am_Value_List all_cmds;
  Am_Value_List new_value;
  Am_Object script_cmd;
  Am_Value_List sel_cmds;
  Am_Object execute_cmd;
  Am_Object AStack_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Value_List local_50;
  Am_Value_List local_40;
  Am_Object local_30;
  Am_Value_List local_28;
  Am_Object local_18;
  
  Am_Object::Get_Object((Am_Object *)&local_28,(Am_Slot_Key)cmd,0x170);
  Am_Object::Get_Object(&AStack_68,(Am_Slot_Key)&local_28,10);
  Am_Object::~Am_Object((Am_Object *)&local_28);
  pAVar2 = Am_Object::Get(&AStack_68,Am_SCRIPT_EXECUTE_COMMAND,0);
  Am_Object::Am_Object(&local_18,pAVar2);
  key = (Am_Slot_Key)&AStack_68;
  Am_Object::Get_Object((Am_Object *)&local_50,key,(ulong)Am_UNDO_SCROLL_GROUP);
  pAVar2 = Am_Object::Get((Am_Object *)&local_50,0x169,0);
  Am_Value_List::Am_Value_List(&local_28,pAVar2);
  Am_Object::~Am_Object((Am_Object *)&local_50);
  local_58.data = (Am_Object_Data *)0x0;
  local_30.data = (Am_Object_Data *)0x0;
  bVar1 = Am_Value_List::Valid(&local_28);
  if (bVar1) {
    Am_Value_List::Start(&local_28);
    pAVar2 = Am_Value_List::Get(&local_28);
    Am_Object::operator=(&local_58,pAVar2);
    pAVar2 = Am_Object::Get(&local_58,0xc5,0);
    Am_Object::operator=(&local_30,pAVar2);
  }
  do_execute_script(&local_18,true,&local_30);
  Am_Object::Get_Object((Am_Object *)&local_40,key,(ulong)Am_UNDO_SCROLL_GROUP);
  pAVar2 = Am_Object::Get((Am_Object *)&local_40,0xa2,0);
  Am_Value_List::Am_Value_List(&local_50,pAVar2);
  Am_Object::~Am_Object((Am_Object *)&local_40);
  Am_Value_List::Start(&local_50);
  bVar1 = Am_Object::Valid(&local_58);
  if (bVar1) {
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_58);
    bVar1 = Am_Value_List::Member(&local_50,pAVar3);
    if (!bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"** Amulet_Error: ",0x11);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Line ",5);
      poVar4 = operator<<((ostream *)&std::cerr,&local_58);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," lost from ",0xb);
      poVar4 = operator<<(poVar4,&AStack_68);
      std::endl<char,std::char_traits<char>>(poVar4);
      Am_Error();
    }
  }
  Am_Value_List::Next(&local_50);
  Am_Value_List::Am_Value_List(&local_40);
  bVar1 = Am_Value_List::Last(&local_50);
  if (!bVar1) {
    pAVar2 = Am_Value_List::Get(&local_50);
    Am_Value_List::Add(&local_40,pAVar2,Am_TAIL,true);
  }
  if (am_sdebug == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"--One_step; Setting value of ",0x1d);
    Am_Object::Get_Object(&local_60,key,(ulong)Am_UNDO_SCROLL_GROUP);
    poVar4 = operator<<((ostream *)&std::cout,&local_60);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," to be ",7);
    poVar4 = operator<<(poVar4,&local_40);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::ostream::flush();
    Am_Object::~Am_Object(&local_60);
  }
  Am_Object::Get_Object(&local_60,key,(ulong)Am_UNDO_SCROLL_GROUP);
  pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_40);
  Am_Object::Set(&local_60,0x169,pAVar3,0);
  Am_Object::~Am_Object(&local_60);
  Am_Value_List::~Am_Value_List(&local_40);
  Am_Value_List::~Am_Value_List(&local_50);
  Am_Object::~Am_Object(&local_30);
  Am_Object::~Am_Object(&local_58);
  Am_Value_List::~Am_Value_List(&local_28);
  Am_Object::~Am_Object(&local_18);
  Am_Object::~Am_Object(&AStack_68);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, am_execute_script_step_one,
                 (Am_Object cmd))
{
  Am_Object script_window = cmd.Get_Object(Am_SAVED_OLD_OWNER).Get_Owner();
  Am_Object execute_cmd = script_window.Get(Am_SCRIPT_EXECUTE_COMMAND);
  Am_Value_List sel_cmds =
      script_window.Get_Object(Am_UNDO_SCROLL_GROUP).Get(Am_VALUE);
  Am_Object line, script_cmd;
  if (sel_cmds.Valid()) {
    sel_cmds.Start();
    line = sel_cmds.Get();
    script_cmd = line.Get(Am_COMMAND);
  }
  do_execute_script(execute_cmd, true, script_cmd);
  Am_Value_List all_cmds =
      script_window.Get_Object(Am_UNDO_SCROLL_GROUP).Get(Am_ITEMS);
  all_cmds.Start();
  if (line.Valid()) {
    if (!all_cmds.Member(line))
      Am_ERROR("Line " << line << " lost from " << script_window);
  }
  //pointer is at line
  all_cmds.Next();
  Am_Value_List new_value;
  if (!all_cmds.Last()) { // otherwise, went past end, leave new_value null
    new_value.Add(all_cmds.Get());
  }
  if (am_sdebug)
    std::cout << "--One_step; Setting value of "
              << script_window.Get_Object(Am_UNDO_SCROLL_GROUP) << " to be "
              << new_value << std::endl
              << std::flush;
  script_window.Get_Object(Am_UNDO_SCROLL_GROUP).Set(Am_VALUE, new_value);
}